

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer.cpp
# Opt level: O3

big_integer * __thiscall big_integer::operator-=(big_integer *this,big_integer *other)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  char __tmp;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  pointer puVar7;
  long lVar8;
  ulong uVar9;
  big_integer local_58;
  big_integer local_38;
  
  if (this->sign == other->sign) {
    bVar4 = compare_without_sign_and_equals(this,other);
    if (bVar4) {
      puVar7 = (other->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(other->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar7;
      if (lVar5 != 0) {
        puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar6 = 0;
        lVar8 = 0;
        do {
          uVar9 = puVar7[lVar8] + uVar6;
          uVar1 = puVar2[lVar8];
          uVar6 = (ulong)(uVar1 < uVar9);
          puVar2[lVar8] = uVar1 - (int)uVar9;
          lVar8 = lVar8 + 1;
        } while ((lVar5 >> 2) + (ulong)(lVar5 >> 2 == 0) != lVar8);
        if (uVar1 < uVar9) {
          *(int *)((long)puVar2 + lVar5) = *(int *)((long)puVar2 + lVar5) + -1;
        }
      }
      goto LAB_0014563e;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_38.digits,&other->digits);
    local_38.sign = other->sign;
    operator-=(&local_38,this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_58.digits,&local_38.digits);
    local_58.sign = local_38.sign;
    if (local_38.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_58.sign = this->sign;
    this->sign = -local_58.sign;
    puVar7 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_58.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = puVar7;
    local_58.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
    local_58.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar3;
  }
  else if (other->sign == -1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_58.digits,&other->digits);
    local_58.sign = '\x01';
    operator+=(this,&local_58);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_58.digits,&other->digits);
    local_58.sign = -1;
    operator+=(this,&local_58);
  }
  if (local_58.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0014563e:
  puVar7 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)puVar7 -
          (long)(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2;
  if (1 < uVar6 && puVar7[-1] == 0) {
    do {
      uVar6 = uVar6 - 1;
      puVar2 = puVar7 + -2;
      puVar7 = puVar7 + -1;
      if (*puVar2 != 0) break;
    } while (1 < uVar6);
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  return this;
}

Assistant:

big_integer &big_integer::operator-=(const big_integer &other) {
    if (sign == other.sign) {
        if (this->compare_without_sign_and_equals(other)) {
            sub(*this, other);
        } else {
            big_integer m = other - (*this);
            m.sign = static_cast<int8_t>(sign * (-1));
            swap(*this, m);
        }
    } else if (other.sign == -1) {
        big_integer m(other);
        m.sign = 1;
        *this += m;
    } else {
        big_integer m(other);
        m.sign = -1;
        *this += m;
    }
    cutBadZero();
    return *this;
}